

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<ProjectBuilderSources>::emplace<ProjectBuilderSources>
          (QGenericArrayOps<ProjectBuilderSources> *this,qsizetype i,ProjectBuilderSources *args)

{
  ProjectBuilderSources **ppPVar1;
  qsizetype *pqVar2;
  undefined2 uVar3;
  Data *pDVar4;
  ProjectBuilderSources *pPVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  QArrayData *pQVar9;
  char16_t *pcVar10;
  qsizetype qVar11;
  QArrayData *pQVar12;
  char16_t *pcVar13;
  qsizetype qVar14;
  Data *pDVar15;
  longlong __old_val_3;
  longlong __old_val;
  QTypedArrayData<char16_t> *__old_val_1;
  char16_t *__old_val_2;
  long in_FS_OFFSET;
  bool bVar16;
  Inserter local_d8;
  ProjectBuilderSources local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<ProjectBuilderSources>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0014ca1b:
    uVar3._0_1_ = args->buildable;
    uVar3._1_1_ = args->object_output;
    local_88._2_6_ = 0xaaaaaaaaaaaa;
    local_88._0_2_ = uVar3;
    pQVar6 = &((args->key).d.d)->super_QArrayData;
    (args->key).d.d = (Data *)0x0;
    pcVar7 = (args->key).d.ptr;
    (args->key).d.ptr = (char16_t *)0x0;
    qVar8 = (args->key).d.size;
    (args->key).d.size = 0;
    pQVar9 = &((args->group).d.d)->super_QArrayData;
    (args->group).d.d = (Data *)0x0;
    pcVar10 = (args->group).d.ptr;
    (args->group).d.ptr = (char16_t *)0x0;
    qVar11 = (args->group).d.size;
    (args->group).d.size = 0;
    pQVar12 = &((args->compiler).d.d)->super_QArrayData;
    (args->compiler).d.d = (Data *)0x0;
    pcVar13 = (args->compiler).d.ptr;
    (args->compiler).d.ptr = (char16_t *)0x0;
    qVar14 = (args->compiler).d.size;
    (args->compiler).d.size = 0;
    bVar16 = (this->super_QArrayDataPointer<ProjectBuilderSources>).size != 0;
    local_88.key.d.d = (Data *)pQVar6;
    local_88.key.d.ptr = pcVar7;
    local_88.key.d.size = qVar8;
    local_88.group.d.d = (Data *)pQVar9;
    local_88.group.d.ptr = pcVar10;
    local_88.group.d.size = qVar11;
    local_88.compiler.d.d = (Data *)pQVar12;
    local_88.compiler.d.ptr = pcVar13;
    local_88.compiler.d.size = qVar14;
    QArrayDataPointer<ProjectBuilderSources>::detachAndGrow
              (&this->super_QArrayDataPointer<ProjectBuilderSources>,(uint)(i == 0 && bVar16),1,
               (ProjectBuilderSources **)0x0,(QArrayDataPointer<ProjectBuilderSources> *)0x0);
    if (i == 0 && bVar16) {
      pPVar5 = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      pPVar5[-1].buildable = (bool)(undefined1)uVar3;
      pPVar5[-1].object_output = (bool)uVar3._1_1_;
      local_88.key.d.d = (Data *)0x0;
      pPVar5[-1].key.d.d = (Data *)pQVar6;
      local_88.key.d.ptr = (char16_t *)0x0;
      pPVar5[-1].key.d.ptr = pcVar7;
      local_88.key.d.size = 0;
      pPVar5[-1].key.d.size = qVar8;
      local_88.group.d.d = (Data *)0x0;
      pPVar5[-1].group.d.d = (Data *)pQVar9;
      local_88.group.d.ptr = (char16_t *)0x0;
      pPVar5[-1].group.d.ptr = pcVar10;
      local_88.group.d.size = 0;
      pPVar5[-1].group.d.size = qVar11;
      local_88.compiler.d.d = (Data *)0x0;
      pPVar5[-1].compiler.d.d = (Data *)pQVar12;
      local_88.compiler.d.ptr = (char16_t *)0x0;
      pPVar5[-1].compiler.d.ptr = pcVar13;
      local_88.compiler.d.size = 0;
      pPVar5[-1].compiler.d.size = qVar14;
      ppPVar1 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      *ppPVar1 = *ppPVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_d8.sourceCopyConstruct = 0;
      local_d8.nSource = 0;
      local_d8.move = 0;
      local_d8.sourceCopyAssign = 0;
      local_d8.end = (ProjectBuilderSources *)0x0;
      local_d8.last = (ProjectBuilderSources *)0x0;
      local_d8.where = (ProjectBuilderSources *)0x0;
      local_d8.begin = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      local_d8.size = (this->super_QArrayDataPointer<ProjectBuilderSources>).size;
      local_d8.data = &this->super_QArrayDataPointer<ProjectBuilderSources>;
      Inserter::insertOne(&local_d8,i,&local_88);
      (local_d8.data)->ptr = local_d8.begin;
      (local_d8.data)->size = local_d8.size;
      if (&(local_88.compiler.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.compiler.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.compiler.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_88.compiler.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.compiler.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if (&(local_88.group.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.group.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.group.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_88.group.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_88.group.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_88.key.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.key.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.key.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    if (((this->super_QArrayDataPointer<ProjectBuilderSources>).size == i) &&
       (pPVar5 = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pPVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x3333333333333333)) {
      bVar16 = args->object_output;
      pPVar5[i].buildable = args->buildable;
      pPVar5[i].object_output = bVar16;
      pDVar15 = (args->key).d.d;
      (args->key).d.d = (Data *)0x0;
      pPVar5[i].key.d.d = pDVar15;
      pcVar7 = (args->key).d.ptr;
      (args->key).d.ptr = (char16_t *)0x0;
      pPVar5[i].key.d.ptr = pcVar7;
      qVar8 = (args->key).d.size;
      (args->key).d.size = 0;
      pPVar5[i].key.d.size = qVar8;
      pDVar15 = (args->group).d.d;
      (args->group).d.d = (Data *)0x0;
      pPVar5[i].group.d.d = pDVar15;
      pcVar7 = (args->group).d.ptr;
      (args->group).d.ptr = (char16_t *)0x0;
      pPVar5[i].group.d.ptr = pcVar7;
      qVar8 = (args->group).d.size;
      (args->group).d.size = 0;
      pPVar5[i].group.d.size = qVar8;
      pDVar15 = (args->compiler).d.d;
      (args->compiler).d.d = (Data *)0x0;
      pPVar5[i].compiler.d.d = pDVar15;
      pcVar7 = (args->compiler).d.ptr;
      (args->compiler).d.ptr = (char16_t *)0x0;
      pPVar5[i].compiler.d.ptr = pcVar7;
      qVar8 = (args->compiler).d.size;
      (args->compiler).d.size = 0;
      pPVar5[i].compiler.d.size = qVar8;
    }
    else {
      if ((i != 0) ||
         (pPVar5 = (this->super_QArrayDataPointer<ProjectBuilderSources>).ptr,
         (ProjectBuilderSources *)
         ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pPVar5))
      goto LAB_0014ca1b;
      bVar16 = args->object_output;
      pPVar5[-1].buildable = args->buildable;
      pPVar5[-1].object_output = bVar16;
      pDVar15 = (args->key).d.d;
      (args->key).d.d = (Data *)0x0;
      pPVar5[-1].key.d.d = pDVar15;
      pcVar7 = (args->key).d.ptr;
      (args->key).d.ptr = (char16_t *)0x0;
      pPVar5[-1].key.d.ptr = pcVar7;
      qVar8 = (args->key).d.size;
      (args->key).d.size = 0;
      pPVar5[-1].key.d.size = qVar8;
      pDVar15 = (args->group).d.d;
      (args->group).d.d = (Data *)0x0;
      pPVar5[-1].group.d.d = pDVar15;
      pcVar7 = (args->group).d.ptr;
      (args->group).d.ptr = (char16_t *)0x0;
      pPVar5[-1].group.d.ptr = pcVar7;
      qVar8 = (args->group).d.size;
      (args->group).d.size = 0;
      pPVar5[-1].group.d.size = qVar8;
      pDVar15 = (args->compiler).d.d;
      (args->compiler).d.d = (Data *)0x0;
      pPVar5[-1].compiler.d.d = pDVar15;
      pcVar7 = (args->compiler).d.ptr;
      (args->compiler).d.ptr = (char16_t *)0x0;
      pPVar5[-1].compiler.d.ptr = pcVar7;
      qVar8 = (args->compiler).d.size;
      (args->compiler).d.size = 0;
      pPVar5[-1].compiler.d.size = qVar8;
      ppPVar1 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).ptr;
      *ppPVar1 = *ppPVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<ProjectBuilderSources>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }